

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.cpp
# Opt level: O0

shared_ptr<const_Assimp::FBX::PropertyTable> __thiscall
Assimp::FBX::Util::GetPropertyTable
          (Util *this,Document *doc,string *templateName,Element *element,Scope *sc,bool no_warn)

{
  bool bVar1;
  Element *pEVar2;
  long lVar3;
  PropertyTemplateMap *pPVar4;
  reference ppVar5;
  Scope *pSVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FBX::PropertyTable> sVar7;
  allocator<char> local_b9;
  string local_b8;
  _Self local_98;
  _Self local_90;
  const_iterator it;
  shared_ptr<const_Assimp::FBX::PropertyTable> templateProps;
  allocator<char> local_61;
  string local_60;
  Element *local_40;
  Element *Properties70;
  Scope *pSStack_30;
  bool no_warn_local;
  Scope *sc_local;
  Element *element_local;
  string *templateName_local;
  Document *doc_local;
  
  Properties70._7_1_ = no_warn;
  pSStack_30 = sc;
  sc_local = (Scope *)element;
  element_local = (Element *)templateName;
  templateName_local = (string *)doc;
  doc_local = (Document *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Properties70",&local_61);
  pEVar2 = Scope::operator[](sc,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_40 = pEVar2;
  std::shared_ptr<Assimp::FBX::PropertyTable_const>::
  shared_ptr<Assimp::FBX::PropertyTable_const,void>
            ((shared_ptr<Assimp::FBX::PropertyTable_const> *)&it,(PropertyTable *)0x0);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    pPVar4 = Document::Templates_abi_cxx11_((Document *)templateName_local);
    local_90._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
         ::find(pPVar4,(key_type *)element_local);
    pPVar4 = Document::Templates_abi_cxx11_((Document *)templateName_local);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
         ::end(pPVar4);
    bVar1 = std::operator!=(&local_90,&local_98);
    if (bVar1) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>
               ::operator*(&local_90);
      std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=
                ((shared_ptr<const_Assimp::FBX::PropertyTable> *)&it,&ppVar5->second);
    }
  }
  if ((local_40 == (Element *)0x0) || (pSVar6 = Element::Compound(local_40), pSVar6 == (Scope *)0x0)
     ) {
    if ((Properties70._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"property table (Properties70) not found",&local_b9);
      DOMWarning(&local_b8,(Element *)sc_local);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&it);
    if (bVar1) {
      std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr
                ((shared_ptr<const_Assimp::FBX::PropertyTable> *)this,
                 (shared_ptr<const_Assimp::FBX::PropertyTable> *)&it);
    }
    else {
      std::make_shared<Assimp::FBX::PropertyTable_const>();
    }
  }
  else {
    std::
    make_shared<Assimp::FBX::PropertyTable_const,Assimp::FBX::Element_const&,std::shared_ptr<Assimp::FBX::PropertyTable_const>&>
              ((Element *)this,(shared_ptr<const_Assimp::FBX::PropertyTable> *)local_40);
  }
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr
            ((shared_ptr<const_Assimp::FBX::PropertyTable> *)&it);
  sVar7.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar7.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FBX::PropertyTable>)
         sVar7.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const PropertyTable> GetPropertyTable(const Document& doc,
    const std::string& templateName,
    const Element &element,
    const Scope& sc,
    bool no_warn /*= false*/)
{
    const Element* const Properties70 = sc["Properties70"];
    std::shared_ptr<const PropertyTable> templateProps = std::shared_ptr<const PropertyTable>(
        static_cast<const PropertyTable*>(NULL));

    if(templateName.length()) {
        PropertyTemplateMap::const_iterator it = doc.Templates().find(templateName);
        if(it != doc.Templates().end()) {
            templateProps = (*it).second;
        }
    }

    if(!Properties70 || !Properties70->Compound()) {
        if(!no_warn) {
            DOMWarning("property table (Properties70) not found",&element);
        }
        if(templateProps) {
            return templateProps;
        }
        else {
            return std::make_shared<const PropertyTable>();
        }
    }
    return std::make_shared<const PropertyTable>(*Properties70,templateProps);
}